

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O3

void wait_for_mapnotify(Display *dpy,Window *xlib_window)

{
  XEvent event_return;
  int local_e0 [48];
  
  do {
    XPeekIfEvent(dpy,local_e0,is_mapnotify,xlib_window);
  } while (local_e0[0] != 0x13);
  return;
}

Assistant:

void
wait_for_mapnotify(Display *dpy, Window *xlib_window)
{
  XEvent event_return;

  while (true) {
    XPeekIfEvent(dpy, &event_return, is_mapnotify, (XPointer)xlib_window);
    // XPeekIfEvent may have returned without setting event_return (in other
    // words, is_mapnotify returned False).
    if (event_return.type == MapNotify)
      return;
  }
}